

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O1

void draw_cells(double *draw_points,int num_draw_points,string *str)

{
  long lVar1;
  CreateDxf Draw;
  CreateDxf local_31;
  
  CreateDxf::CreateDxf(&local_31);
  CreateDxf::DxfBegin(&local_31,str);
  if (0 < num_draw_points) {
    lVar1 = 0;
    do {
      CreateDxf::line(&local_31,(float)*(double *)((long)draw_points + lVar1),
                      (float)*(double *)((long)draw_points + lVar1 + 8),
                      (float)*(double *)((long)draw_points + lVar1 + 0x10),
                      (float)*(double *)((long)draw_points + lVar1 + 0x18),
                      (float)*(double *)((long)draw_points + lVar1 + 0x20),
                      (float)*(double *)((long)draw_points + lVar1 + 0x28),str);
      lVar1 = lVar1 + 0x30;
    } while ((ulong)(uint)num_draw_points * 0x30 != lVar1);
  }
  CreateDxf::DxfEnd(&local_31,str);
  CreateDxf::~CreateDxf(&local_31);
  return;
}

Assistant:

void draw_cells(double *draw_points, int num_draw_points, string &str)
{
	CreateDxf Draw;
	Draw.DxfBegin(str);
	float x1, y1, z1, x2, y2, z2;
	for (int i = 0; i < num_draw_points; i++)
	{
		x1 = draw_points[i * 6];
		y1 = draw_points[i * 6 + 1];
		z1 = draw_points[i * 6 + 2];
		x2 = draw_points[i * 6 + 3];
		y2 = draw_points[i * 6 + 4];
		z2 = draw_points[i * 6 + 5];
		Draw.line(x1, y1, z1, x2, y2, z2, str);
	}
	Draw.DxfEnd(str);
}